

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cc
# Opt level: O1

int main(void)

{
  void *__buf;
  FILE *__n;
  bool bVar1;
  Pl_ASCIIHexDecoder decode;
  Pl_StdioFile out;
  uchar buf [10000];
  Pl_ASCIIHexDecoder local_27b8;
  Pl_StdioFile local_2770;
  undefined1 local_2738 [10008];
  
  Pl_StdioFile::Pl_StdioFile(&local_2770,"stdout",_stdout);
  Pl_ASCIIHexDecoder::Pl_ASCIIHexDecoder(&local_27b8,"decode",&local_2770.super_Pipeline);
  bVar1 = false;
  do {
    __n = _stdin;
    __buf = (void *)fread(local_2738,1,10000,_stdin);
    if (__buf == (void *)0x0) {
      bVar1 = true;
    }
    else {
      Pl_ASCIIHexDecoder::write(&local_27b8,(int)local_2738,__buf,(size_t)__n);
    }
  } while (!bVar1);
  Pl_ASCIIHexDecoder::finish(&local_27b8);
  local_27b8.super_Pipeline._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002edaa0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_27b8.super_Pipeline.identifier._M_dataplus._M_p !=
      &local_27b8.super_Pipeline.identifier.field_2) {
    operator_delete(local_27b8.super_Pipeline.identifier._M_dataplus._M_p,
                    local_27b8.super_Pipeline.identifier.field_2._M_allocated_capacity + 1);
  }
  Pl_StdioFile::~Pl_StdioFile(&local_2770);
  return 0;
}

Assistant:

int
main()
{
    Pl_StdioFile out("stdout", stdout);
    Pl_ASCIIHexDecoder decode("decode", &out);

    try {
        unsigned char buf[10000];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), stdin);
            if (len <= 0) {
                done = true;
            } else {
                decode.write(buf, len);
            }
        }
        decode.finish();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}